

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

void Wlc_NtkPrintDistrib(Wlc_Ntk_t *p,int fVerbose)

{
  ushort uVar1;
  Wlc_Obj_t *pWVar2;
  Vec_Wrd_t *p_00;
  Vec_Wrd_t *p_01;
  void *pvVar3;
  ulong uVar4;
  int iVar5;
  undefined8 *__ptr;
  void *pvVar6;
  Vec_Ptr_t *vTypes;
  void **__s;
  Vec_Ptr_t *vOccurs;
  void **__s_00;
  undefined8 *puVar7;
  char *pcVar8;
  int iVar9;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *paVar10;
  ushort uVar11;
  int iVar12;
  ulong uVar13;
  word Entry;
  uint uVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  Wlc_Obj_t *pWVar23;
  Wlc_Obj_t *pWVar24;
  double dVar25;
  
  __ptr = (undefined8 *)malloc(0x10);
  *__ptr = 0x36;
  pvVar6 = malloc(0xd8);
  __ptr[1] = pvVar6;
  *(undefined4 *)((long)__ptr + 4) = 0x36;
  lVar22 = 0;
  memset(pvVar6,0,0xd8);
  vTypes = (Vec_Ptr_t *)malloc(0x10);
  vTypes->nCap = 0x36;
  vTypes->nSize = 0;
  __s = (void **)malloc(0x1b0);
  vTypes->pArray = __s;
  vTypes->nSize = 0x36;
  memset(__s,0,0x1b0);
  vOccurs = (Vec_Ptr_t *)malloc(0x10);
  vOccurs->nCap = 0x36;
  vOccurs->nSize = 0;
  __s_00 = (void **)malloc(0x1b0);
  vOccurs->pArray = __s_00;
  vOccurs->nSize = 0x36;
  memset(__s_00,0,0x1b0);
  do {
    puVar7 = (undefined8 *)malloc(0x10);
    *puVar7 = 0x10;
    pvVar6 = malloc(0x80);
    puVar7[1] = pvVar6;
    __s[lVar22] = puVar7;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 0x36);
  lVar22 = 0;
  do {
    puVar7 = (undefined8 *)malloc(0x10);
    *puVar7 = 0x10;
    pvVar6 = malloc(0x80);
    puVar7[1] = pvVar6;
    __s_00[lVar22] = puVar7;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 0x36);
  if (p->iObj < 2) {
    uVar21 = 0;
    pWVar24 = (Wlc_Obj_t *)0x0;
  }
  else {
    uVar19 = 1;
    uVar21 = 0;
    pWVar23 = (Wlc_Obj_t *)0x0;
    do {
      if ((long)p->nObjsAlloc <= (long)uVar19) goto LAB_0030ec46;
      pWVar2 = p->pObjs;
      iVar5 = pWVar2[uVar19].End - pWVar2[uVar19].Beg;
      iVar9 = -iVar5;
      if (0 < iVar5) {
        iVar9 = iVar5;
      }
      if (iVar9 * 2 - 0x1ffffeU < 0xffe00000) {
        printf("Object %6d has range %d, which is reduced to %d in the statistics.\n",
               uVar19 & 0xffffffff,(ulong)(iVar9 + 1U),(ulong)(iVar9 + 1U & 0xfffff));
      }
      pWVar2 = pWVar2 + uVar19;
      iVar9 = pWVar2->Beg;
      pWVar24 = pWVar23;
      if (pWVar23 == (Wlc_Obj_t *)0x0) {
        pWVar24 = pWVar2;
      }
      if (iVar9 == 0) {
        pWVar24 = pWVar23;
      }
      uVar1 = *(ushort *)pWVar2;
      if ((uVar1 & 0x3d) == 1) {
LAB_0030ce84:
        iVar12 = pWVar2->End - iVar9;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        Entry = (word)((uVar1 >> 6 & 1) + iVar5 * 2 + 2);
      }
      else {
        uVar11 = uVar1 & 0x3f;
        if (uVar11 < 0x36) {
          if ((0x24000007408080U >> uVar11 & 1) == 0) {
            if ((0x800040UL >> uVar11 & 1) != 0) goto LAB_0030ce84;
            goto LAB_0030d02d;
          }
          iVar12 = pWVar2->End - iVar9;
          iVar5 = -iVar12;
          if (0 < iVar12) {
            iVar5 = iVar12;
          }
          paVar10 = &pWVar2->field_9;
          if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
LAB_0030ceea:
            paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)(pWVar2->field_9).pFanins[0];
          }
        }
        else {
LAB_0030d02d:
          uVar14 = pWVar2->nFanins;
          if (uVar14 != 1) {
            if ((int)uVar14 < 2) {
              __assert_fail("Wlc_ObjFaninNum(pObj) >= 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcNtk.c"
                            ,0x155,"void Wlc_NtkPrintDistrib(Wlc_Ntk_t *, int)");
            }
            iVar12 = pWVar2->End - iVar9;
            iVar5 = -iVar12;
            if (0 < iVar12) {
              iVar5 = iVar12;
            }
            paVar10 = &pWVar2->field_9;
            if ((uVar1 & 0x2f) == 6 || uVar14 != 2) {
              paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
            }
            lVar22 = (long)paVar10->Fanins[0];
            if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
            pWVar23 = p->pObjs;
            iVar17 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
            iVar12 = -iVar17;
            if (0 < iVar17) {
              iVar12 = iVar17;
            }
            paVar10 = &pWVar2->field_9;
            if ((uVar1 & 0x2f) == 6 || uVar14 != 2) {
              paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
            }
            lVar16 = (long)paVar10->Fanins[1];
            if ((lVar16 < 1) || (p->nObjsAlloc <= paVar10->Fanins[1])) goto LAB_0030ec46;
            iVar18 = pWVar23[lVar16].End - pWVar23[lVar16].Beg;
            iVar17 = -iVar18;
            if (0 < iVar18) {
              iVar17 = iVar18;
            }
            Entry = (ulong)((uVar1 >> 6 & 1) + iVar5 * 2 + 2) |
                    (ulong)((*(uint *)(pWVar23 + lVar16) >> 6 & 1) + iVar17 * 2 + 2) << 0x2a |
                    (ulong)((*(uint *)(pWVar23 + lVar22) >> 6 & 1) + iVar12 * 2 + 2) << 0x15;
            goto LAB_0030cf4a;
          }
          iVar12 = pWVar2->End - iVar9;
          iVar5 = -iVar12;
          if (0 < iVar12) {
            iVar5 = iVar12;
          }
          paVar10 = &pWVar2->field_9;
          if ((uVar1 & 0x2f) == 6) goto LAB_0030ceea;
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        pWVar23 = p->pObjs;
        iVar17 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar12 = -iVar17;
        if (0 < iVar17) {
          iVar12 = iVar17;
        }
        Entry = (ulong)((uVar1 >> 6 & 1) + iVar5 * 2 + 2) |
                (ulong)((*(uint *)(pWVar23 + lVar22) >> 6 & 1) + iVar12 * 2 + 2) << 0x15;
      }
LAB_0030cf4a:
      if (0x35 < (ushort)(uVar1 & 0x3f)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar13 = (ulong)((uVar1 & 0x3f) << 3);
      p_00 = *(Vec_Wrd_t **)((long)__s + uVar13);
      p_01 = *(Vec_Wrd_t **)((long)__s_00 + uVar13);
      if (0 < (long)p_00->nSize) {
        lVar22 = 0;
        do {
          if (p_00->pArray[lVar22] == Entry) {
            if (p_01->nSize <= (int)lVar22) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                            ,0x1bf,"word Vec_WrdAddToEntry(Vec_Wrd_t *, int, word)");
            }
            p_01->pArray[lVar22] = p_01->pArray[lVar22] + 1;
            goto LAB_0030cfbe;
          }
          lVar22 = lVar22 + 1;
        } while (p_00->nSize != lVar22);
      }
      Vec_WrdPush(p_00,Entry);
      Vec_WrdPush(p_01,1);
LAB_0030cfbe:
      uVar1 = *(ushort *)pWVar2;
      switch(uVar1 & 0x3f) {
      case 8:
        if (*(int *)((long)__ptr + 4) < 9) {
LAB_0030eca3:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        iVar12 = pWVar2->End - pWVar2->Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0x20) =
             *(int *)(__ptr[1] + 0x20) + (pWVar2->nFanins - 2) * (iVar5 * 3 + 3);
        break;
      case 9:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 10) goto LAB_0030eca3;
        uVar15 = pWVar2->End - pWVar2->Beg;
        uVar14 = -uVar15;
        if (0 < (int)uVar15) {
          uVar14 = uVar15;
        }
        uVar15 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar15 == 0; uVar15 = uVar15 - 1) {
          }
        }
        iVar5 = 1;
        if (pWVar2->End != pWVar2->Beg) {
          iVar5 = (uVar15 ^ 0xffffffe0) + 0x21;
        }
        iVar17 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar12 = -iVar17;
        if (0 < iVar17) {
          iVar12 = iVar17;
        }
        iVar17 = iVar12 + 1;
        if (iVar5 <= iVar12 + 1) {
          iVar17 = iVar5;
        }
        *(int *)(__ptr[1] + 0x24) = *(int *)(__ptr[1] + 0x24) + iVar17 * 3;
        break;
      case 10:
        uVar15 = pWVar2->End - pWVar2->Beg;
        uVar14 = -uVar15;
        if (0 < (int)uVar15) {
          uVar14 = uVar15;
        }
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0xb) goto LAB_0030eca3;
        uVar15 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar15 == 0; uVar15 = uVar15 - 1) {
          }
        }
        iVar5 = 1;
        if (pWVar2->End != pWVar2->Beg) {
          iVar5 = (uVar15 ^ 0xffffffe0) + 0x21;
        }
        iVar17 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar12 = -iVar17;
        if (0 < iVar17) {
          iVar12 = iVar17;
        }
        iVar17 = iVar12 + 1;
        if (iVar5 <= iVar12 + 1) {
          iVar17 = iVar5;
        }
        *(int *)(__ptr[1] + 0x28) = *(int *)(__ptr[1] + 0x28) + (uVar14 * 3 + 3) * iVar17;
        break;
      case 0xb:
        uVar15 = pWVar2->End - pWVar2->Beg;
        uVar14 = -uVar15;
        if (0 < (int)uVar15) {
          uVar14 = uVar15;
        }
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0xc) goto LAB_0030eca3;
        uVar15 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar15 == 0; uVar15 = uVar15 - 1) {
          }
        }
        iVar5 = 1;
        if (pWVar2->End != pWVar2->Beg) {
          iVar5 = (uVar15 ^ 0xffffffe0) + 0x21;
        }
        iVar17 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar12 = -iVar17;
        if (0 < iVar17) {
          iVar12 = iVar17;
        }
        iVar17 = iVar12 + 1;
        if (iVar5 <= iVar12 + 1) {
          iVar17 = iVar5;
        }
        *(int *)(__ptr[1] + 0x2c) = *(int *)(__ptr[1] + 0x2c) + (uVar14 * 3 + 3) * iVar17;
        break;
      case 0xc:
        uVar15 = pWVar2->End - pWVar2->Beg;
        uVar14 = -uVar15;
        if (0 < (int)uVar15) {
          uVar14 = uVar15;
        }
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0xd) goto LAB_0030eca3;
        uVar15 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar15 == 0; uVar15 = uVar15 - 1) {
          }
        }
        iVar5 = 1;
        if (pWVar2->End != pWVar2->Beg) {
          iVar5 = (uVar15 ^ 0xffffffe0) + 0x21;
        }
        iVar17 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar12 = -iVar17;
        if (0 < iVar17) {
          iVar12 = iVar17;
        }
        iVar17 = iVar12 + 1;
        if (iVar5 <= iVar12 + 1) {
          iVar17 = iVar5;
        }
        *(int *)(__ptr[1] + 0x30) = *(int *)(__ptr[1] + 0x30) + (uVar14 * 3 + 3) * iVar17;
        break;
      case 0xd:
        uVar15 = pWVar2->End - pWVar2->Beg;
        uVar14 = -uVar15;
        if (0 < (int)uVar15) {
          uVar14 = uVar15;
        }
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0xe) goto LAB_0030eca3;
        uVar15 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar15 == 0; uVar15 = uVar15 - 1) {
          }
        }
        iVar5 = 1;
        if (pWVar2->End != pWVar2->Beg) {
          iVar5 = (uVar15 ^ 0xffffffe0) + 0x21;
        }
        iVar17 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar12 = -iVar17;
        if (0 < iVar17) {
          iVar12 = iVar17;
        }
        iVar17 = iVar12 + 1;
        if (iVar5 <= iVar12 + 1) {
          iVar17 = iVar5;
        }
        *(int *)(__ptr[1] + 0x34) = *(int *)(__ptr[1] + 0x34) + (uVar14 * 3 + 3) * iVar17;
        break;
      case 0xe:
        uVar15 = pWVar2->End - pWVar2->Beg;
        uVar14 = -uVar15;
        if (0 < (int)uVar15) {
          uVar14 = uVar15;
        }
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0xf) goto LAB_0030eca3;
        uVar15 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar15 == 0; uVar15 = uVar15 - 1) {
          }
        }
        iVar5 = 1;
        if (pWVar2->End != pWVar2->Beg) {
          iVar5 = (uVar15 ^ 0xffffffe0) + 0x21;
        }
        iVar17 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar12 = -iVar17;
        if (0 < iVar17) {
          iVar12 = iVar17;
        }
        iVar17 = iVar12 + 1;
        if (iVar5 <= iVar12 + 1) {
          iVar17 = iVar5;
        }
        *(int *)(__ptr[1] + 0x38) = *(int *)(__ptr[1] + 0x38) + (uVar14 * 3 + 3) * iVar17;
        break;
      case 0xf:
        if (*(int *)((long)__ptr + 4) < 0x10) goto LAB_0030eca3;
        break;
      case 0x10:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x11) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0x40) = iVar5 + *(int *)(__ptr[1] + 0x40) + 1;
        break;
      case 0x11:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x12) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0x44) = iVar5 + *(int *)(__ptr[1] + 0x44) + 1;
        break;
      case 0x12:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x13) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0x48) = iVar5 * 3 + *(int *)(__ptr[1] + 0x48) + 3;
        break;
      case 0x13:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x14) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0x4c) = iVar5 + *(int *)(__ptr[1] + 0x4c) + 1;
        break;
      case 0x14:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x15) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0x50) = iVar5 + *(int *)(__ptr[1] + 0x50) + 1;
        break;
      case 0x15:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x16) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0x54) = iVar5 * 3 + *(int *)(__ptr[1] + 0x54) + 3;
        break;
      case 0x16:
        if (*(int *)((long)__ptr + 4) < 0x17) goto LAB_0030eca3;
        break;
      case 0x17:
        if (*(int *)((long)__ptr + 4) < 0x18) goto LAB_0030eca3;
        break;
      case 0x18:
        if (*(int *)((long)__ptr + 4) < 0x19) goto LAB_0030eca3;
        break;
      case 0x19:
        if (*(int *)((long)__ptr + 4) < 0x1a) goto LAB_0030eca3;
        break;
      case 0x1a:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x1b) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0x68) = *(int *)(__ptr[1] + 0x68) + iVar5;
        break;
      case 0x1b:
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) {
LAB_0030ec46:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlc.h"
                        ,0xa9,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        pWVar23 = p->pObjs;
        iVar12 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[1];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[1])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x1c) goto LAB_0030eca3;
        iVar17 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar12 = -iVar17;
        if (0 < iVar17) {
          iVar12 = iVar17;
        }
        *(int *)(__ptr[1] + 0x6c) = *(int *)(__ptr[1] + 0x6c) + iVar5 + iVar12 + 1;
        break;
      case 0x1c:
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        pWVar23 = p->pObjs;
        iVar12 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[1];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[1])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x1d) goto LAB_0030eca3;
        iVar17 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar12 = -iVar17;
        if (0 < iVar17) {
          iVar12 = iVar17;
        }
        *(int *)(__ptr[1] + 0x70) = *(int *)(__ptr[1] + 0x70) + iVar5 + iVar12 + 1;
        break;
      case 0x1d:
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        pWVar23 = p->pObjs;
        iVar12 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[1];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[1])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x1e) goto LAB_0030eca3;
        iVar17 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar12 = -iVar17;
        if (0 < iVar17) {
          iVar12 = iVar17;
        }
        *(int *)(__ptr[1] + 0x74) = *(int *)(__ptr[1] + 0x74) + iVar5 + iVar12 + 1;
        break;
      case 0x1e:
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        pWVar23 = p->pObjs;
        iVar12 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[1];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[1])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x1f) goto LAB_0030eca3;
        iVar17 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar12 = -iVar17;
        if (0 < iVar17) {
          iVar12 = iVar17;
        }
        *(int *)(__ptr[1] + 0x78) = *(int *)(__ptr[1] + 0x78) + iVar5 + iVar12 + 3;
        break;
      case 0x1f:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x20) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0x7c) = *(int *)(__ptr[1] + 0x7c) + iVar5 * 4 + 3;
        break;
      case 0x20:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x21) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0x80) = *(int *)(__ptr[1] + 0x80) + iVar5 * 4 + 3;
        break;
      case 0x21:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x22) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0x84) = *(int *)(__ptr[1] + 0x84) + iVar5 * 6;
        break;
      case 0x22:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x23) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0x88) = *(int *)(__ptr[1] + 0x88) + iVar5 * 6;
        break;
      case 0x23:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x24) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0x8c) = *(int *)(__ptr[1] + 0x8c) + iVar5 * 6;
        break;
      case 0x24:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x25) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0x90) = *(int *)(__ptr[1] + 0x90) + iVar5 * 6;
        break;
      case 0x25:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x26) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0x94) = *(int *)(__ptr[1] + 0x94) + iVar5;
        break;
      case 0x26:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x27) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0x98) = *(int *)(__ptr[1] + 0x98) + iVar5;
        break;
      case 0x27:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x28) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0x9c) = *(int *)(__ptr[1] + 0x9c) + iVar5 * 3;
        break;
      case 0x28:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x29) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0xa0) = *(int *)(__ptr[1] + 0xa0) + iVar5;
        break;
      case 0x29:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x2a) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0xa4) = *(int *)(__ptr[1] + 0xa4) + iVar5;
        break;
      case 0x2a:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x2b) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0xa8) = *(int *)(__ptr[1] + 0xa8) + iVar5 * 3;
        break;
      case 0x2b:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x2c) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0xac) = iVar5 * 9 + *(int *)(__ptr[1] + 0xac) + 9;
        break;
      case 0x2c:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x2d) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 0xb0) = iVar5 * 9 + *(int *)(__ptr[1] + 0xb0) + 9;
        break;
      case 0x2d:
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        pWVar23 = p->pObjs;
        iVar12 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[1];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[1])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x2e) goto LAB_0030eca3;
        iVar17 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar12 = -iVar17;
        if (0 < iVar17) {
          iVar12 = iVar17;
        }
        *(int *)(__ptr[1] + 0xb4) = *(int *)(__ptr[1] + 0xb4) + (iVar12 + 1) * (iVar5 * 9 + 9);
        break;
      case 0x2e:
        uVar14 = pWVar2->nFanins;
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar14) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (iVar5 = p->nObjsAlloc, iVar5 <= paVar10->Fanins[0])) goto LAB_0030ec46;
        pWVar23 = p->pObjs;
        iVar17 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar12 = -iVar17;
        if (0 < iVar17) {
          iVar12 = iVar17;
        }
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar14) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (iVar5 <= paVar10->Fanins[0])) goto LAB_0030ec46;
        iVar18 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar17 = -iVar18;
        if (0 < iVar18) {
          iVar17 = iVar18;
        }
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar14) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (iVar5 <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x2f) goto LAB_0030eca3;
        iVar18 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar5 = -iVar18;
        if (0 < iVar18) {
          iVar5 = iVar18;
        }
        *(int *)(__ptr[1] + 0xb8) =
             iVar5 * -0x13 + (iVar17 + 1) * (iVar12 * 0xd + 0xd) + *(int *)(__ptr[1] + 0xb8) + -9;
        break;
      case 0x2f:
        uVar14 = pWVar2->nFanins;
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar14) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (iVar5 = p->nObjsAlloc, iVar5 <= paVar10->Fanins[0])) goto LAB_0030ec46;
        pWVar23 = p->pObjs;
        iVar17 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar12 = -iVar17;
        if (0 < iVar17) {
          iVar12 = iVar17;
        }
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar14) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (iVar5 <= paVar10->Fanins[0])) goto LAB_0030ec46;
        iVar18 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar17 = -iVar18;
        if (0 < iVar18) {
          iVar17 = iVar18;
        }
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar14) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (iVar5 <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x30) goto LAB_0030eca3;
        iVar18 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar5 = -iVar18;
        if (0 < iVar18) {
          iVar5 = iVar18;
        }
        *(int *)(__ptr[1] + 0xbc) =
             iVar5 * -7 + (iVar17 + 1) * (iVar12 * 0xd + 0xd) + *(int *)(__ptr[1] + 0xbc) + -9;
        break;
      case 0x30:
        uVar14 = pWVar2->nFanins;
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar14) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (iVar5 = p->nObjsAlloc, iVar5 <= paVar10->Fanins[0])) goto LAB_0030ec46;
        pWVar23 = p->pObjs;
        iVar17 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar12 = -iVar17;
        if (0 < iVar17) {
          iVar12 = iVar17;
        }
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar14) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (iVar5 <= paVar10->Fanins[0])) goto LAB_0030ec46;
        iVar18 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar17 = -iVar18;
        if (0 < iVar18) {
          iVar17 = iVar18;
        }
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar14) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (iVar5 <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x31) goto LAB_0030eca3;
        iVar18 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar5 = -iVar18;
        if (0 < iVar18) {
          iVar5 = iVar18;
        }
        *(int *)(__ptr[1] + 0xc0) =
             iVar5 * -7 + (iVar17 + 1) * (iVar12 * 0xd + 0xd) + *(int *)(__ptr[1] + 0xc0) + -9;
        break;
      case 0x31:
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        pWVar23 = p->pObjs;
        iVar12 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        iVar17 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar12 = -iVar17;
        if (0 < iVar17) {
          iVar12 = iVar17;
        }
        dVar25 = pow((double)(iVar5 + 1),(double)(iVar12 + 1));
        if (*(int *)((long)__ptr + 4) < 0x32) goto LAB_0030eca3;
        *(int *)(__ptr[1] + 0xc4) = *(int *)(__ptr[1] + 0xc4) + (int)dVar25 * 10;
        break;
      case 0x32:
        paVar10 = &pWVar2->field_9;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x33) goto LAB_0030eca3;
        iVar12 = p->pObjs[lVar22].End - p->pObjs[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        *(int *)(__ptr[1] + 200) = *(int *)(__ptr[1] + 200) + iVar5 * 4 + 4;
        break;
      case 0x33:
        uVar14 = pWVar2->nFanins;
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar14) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (iVar5 = p->nObjsAlloc, iVar5 <= paVar10->Fanins[0])) goto LAB_0030ec46;
        pWVar23 = p->pObjs;
        iVar17 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar12 = -iVar17;
        if (0 < iVar17) {
          iVar12 = iVar17;
        }
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar14) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (iVar5 <= paVar10->Fanins[0])) goto LAB_0030ec46;
        iVar18 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar17 = -iVar18;
        if (0 < iVar18) {
          iVar17 = iVar18;
        }
        iVar17 = (iVar17 + 1) * (iVar12 * 0xb + 0xb);
        iVar12 = iVar17 + 7;
        if (-1 < iVar17) {
          iVar12 = iVar17;
        }
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar14) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (iVar5 <= paVar10->Fanins[0])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x34) goto LAB_0030eca3;
        iVar17 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar5 = -iVar17;
        if (0 < iVar17) {
          iVar5 = iVar17;
        }
        *(int *)(__ptr[1] + 0xcc) =
             ((iVar5 * 5 - (iVar5 * 5 + 5 >> 0x1f)) + 5 >> 1) +
             (iVar12 >> 3) + *(int *)(__ptr[1] + 0xcc) + -5;
        break;
      case 0x34:
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[0];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[0])) goto LAB_0030ec46;
        pWVar23 = p->pObjs;
        iVar12 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar5 = -iVar12;
        if (0 < iVar12) {
          iVar5 = iVar12;
        }
        paVar10 = &pWVar2->field_9;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar10 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__9 *)paVar10->pFanins[0];
        }
        lVar22 = (long)paVar10->Fanins[1];
        if ((lVar22 < 1) || (p->nObjsAlloc <= paVar10->Fanins[1])) goto LAB_0030ec46;
        if (*(int *)((long)__ptr + 4) < 0x35) goto LAB_0030eca3;
        iVar17 = pWVar23[lVar22].End - pWVar23[lVar22].Beg;
        iVar12 = -iVar17;
        if (0 < iVar17) {
          iVar12 = iVar17;
        }
        *(int *)(__ptr[1] + 0xd0) = *(int *)(__ptr[1] + 0xd0) + (iVar12 + 1) * (iVar5 * 5 + 5);
      }
      uVar21 = uVar21 + (iVar9 != 0);
      uVar19 = uVar19 + 1;
      pWVar23 = pWVar24;
    } while ((long)uVar19 < (long)p->iObj);
  }
  if (uVar21 != 0) {
    printf("Warning: %d objects of the design have non-zero-based ranges.\n",(ulong)uVar21);
    uVar19 = ((long)pWVar24 - (long)p->pObjs >> 3) * -0x5555555555555555;
    uVar21 = (uint)uVar19;
    if (((int)uVar21 < 0) || ((p->vNameIds).nSize <= (int)uVar21)) {
LAB_0030ec65:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pcVar8 = Abc_NamStr(p->pManName,(p->vNameIds).pArray[uVar21 & 0x7fffffff]);
    iVar5 = pWVar24->End - pWVar24->Beg;
    iVar9 = -iVar5;
    if (0 < iVar5) {
      iVar9 = iVar5;
    }
    printf("In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n",uVar19 & 0xffffffff,
           pcVar8,(ulong)(iVar9 + 1));
  }
  puts("ID  :  name  occurrence    and2 (occurrence)<output_range>=<input_range>.<input_range> ...")
  ;
  uVar19 = 0;
  do {
    if (p->nObjs[uVar19] != 0) {
      if ((long)*(int *)((long)__ptr + 4) <= (long)uVar19) goto LAB_0030ec65;
      pvVar6 = __s[uVar19];
      pvVar3 = __s_00[uVar19];
      printf("%2d  :  %-8s  %6d%8d ",uVar19 & 0xffffffff,Wlc_Names[uVar19],
             (ulong)(uint)p->nObjs[uVar19],(ulong)*(uint *)(__ptr[1] + uVar19 * 4));
      Wlc_NtkPrintDistribSortOne(vTypes,vOccurs,(int)uVar19);
      if (0 < *(int *)((long)pvVar6 + 4)) {
        uVar13 = 0;
        do {
          uVar4 = *(ulong *)(*(long *)((long)pvVar6 + 8) + uVar13 * 8);
          if ((((int)(uVar13 / 6) * 6 + 5U == (uint)uVar13) && (0x3ffffffffff < uVar4)) ||
             (((~(uint)uVar13 & 7) == 0 && (uVar4 < 0x40000000000)))) {
            printf("\n                                ");
          }
          if ((long)*(int *)((long)pvVar3 + 4) <= (long)uVar13) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                          ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
          }
          uVar20 = uVar4 >> 0x15;
          printf("(%d)",(ulong)*(uint *)(*(long *)((long)pvVar3 + 8) + uVar13 * 8));
          pcVar8 = "-";
          if ((uVar4 & 1) == 0) {
            pcVar8 = "";
          }
          printf("%s%d",pcVar8,(ulong)((uint)(uVar4 >> 1) & 0xfffff));
          if ((uVar20 & 0x1fffff) != 0) {
            pcVar8 = "-";
            if ((uVar20 & 1) == 0) {
              pcVar8 = "";
            }
            printf("=%s%d",pcVar8,(ulong)(((uint)uVar20 & 0x1fffff) >> 1));
          }
          if (0x3ffffffffff < uVar4) {
            pcVar8 = "-";
            if ((uVar4 >> 0x2a & 1) == 0) {
              pcVar8 = "";
            }
            printf(".%s%d",pcVar8,uVar4 >> 0x2b);
          }
          putchar(0x20);
          uVar13 = uVar13 + 1;
        } while ((long)uVar13 < (long)*(int *)((long)pvVar6 + 4));
      }
      putchar(10);
    }
    uVar19 = uVar19 + 1;
    if (uVar19 == 0x36) {
      lVar22 = 0;
      do {
        pvVar6 = __s[lVar22];
        if (pvVar6 != (void *)0x0) {
          if (*(void **)((long)pvVar6 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar6 + 8));
            *(undefined8 *)((long)pvVar6 + 8) = 0;
          }
          free(pvVar6);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != 0x36);
      if (__s != (void **)0x0) {
        free(__s);
        vTypes->pArray = (void **)0x0;
      }
      free(vTypes);
      lVar22 = 0;
      do {
        pvVar6 = __s_00[lVar22];
        if (pvVar6 != (void *)0x0) {
          if (*(void **)((long)pvVar6 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar6 + 8));
            *(undefined8 *)((long)pvVar6 + 8) = 0;
          }
          free(pvVar6);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != 0x36);
      if (__s_00 != (void **)0x0) {
        free(__s_00);
        vOccurs->pArray = (void **)0x0;
      }
      free(vOccurs);
      if ((void *)__ptr[1] != (void *)0x0) {
        free((void *)__ptr[1]);
        __ptr[1] = 0;
      }
      free(__ptr);
      return;
    }
  } while( true );
}

Assistant:

void Wlc_NtkPrintDistrib( Wlc_Ntk_t * p, int fVerbose )
{
    Wlc_Obj_t * pObj, * pObjRange = NULL; int nCountRange = 0;
    Vec_Ptr_t * vTypes, * vOccurs;
    Vec_Int_t * vAnds = Vec_IntStart( WLC_OBJ_NUMBER );
    word Sign;
    int i, k, s, s0, s1;
    // allocate statistics arrays
    vTypes  = Vec_PtrStart( WLC_OBJ_NUMBER );
    vOccurs = Vec_PtrStart( WLC_OBJ_NUMBER );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
        Vec_PtrWriteEntry( vTypes, i, Vec_WrdAlloc(16) );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
        Vec_PtrWriteEntry( vOccurs, i, Vec_WrdAlloc(16) );
    // add nodes
    Wlc_NtkForEachObj( p, pObj, i )
    {
//        char * pName = Wlc_ObjName(p, i);
        if ( Wlc_ObjSign(pObj) > 0x1FFFFF )
            printf( "Object %6d has range %d, which is reduced to %d in the statistics.\n", 
                i, Wlc_ObjRange(pObj), Wlc_ObjRange(pObj) & 0xFFFFF );
        if ( pObj->Beg )
        {
            if ( pObjRange == NULL )
                pObjRange = pObj;
            nCountRange++;
        }
        // 0-input types
        if ( Wlc_ObjIsCi(pObj) || pObj->Type == WLC_OBJ_CONST || pObj->Type == WLC_OBJ_BIT_CONCAT )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), 0, 0 );
        // 1-input types
        else if ( pObj->Type == WLC_OBJ_BUF    || pObj->Type == WLC_OBJ_BIT_SELECT  || pObj->Type == WLC_OBJ_TABLE ||
             pObj->Type == WLC_OBJ_BIT_ZEROPAD || pObj->Type == WLC_OBJ_BIT_SIGNEXT || 
             pObj->Type == WLC_OBJ_BIT_NOT     || pObj->Type == WLC_OBJ_LOGIC_NOT   || pObj->Type == WLC_OBJ_ARI_MINUS )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)), 0 );
        // 2-input types (including MUX)
        else if ( Wlc_ObjFaninNum(pObj) == 1 )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)), 0 );
        else
        {
            assert( Wlc_ObjFaninNum(pObj) >= 2 );
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)), Wlc_ObjSign(Wlc_ObjFanin1(p, pObj)) );
        }
        // add to storage
        Wlc_NtkPrintDistribAddOne( vTypes, vOccurs, pObj->Type, Sign );
        // count the number of AIG nodes
        if ( pObj->Type == WLC_OBJ_MUX )
            Vec_IntAddToEntry( vAnds, WLC_OBJ_MUX,      3 * Wlc_ObjRange(pObj) * (Wlc_ObjFaninNum(pObj) - 2) );
        else if ( pObj->Type == WLC_OBJ_SHIFT_R )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_R,  Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_RA )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_RA, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_L )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_L,  Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_LA )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_LA, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_ROTATE_R )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ROTATE_R, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_ROTATE_L )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ROTATE_L, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_BIT_NOT )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NOT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_AND )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_AND,      Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_OR )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_OR,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_XOR )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_XOR,  3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NAND )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NAND,     Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NOR )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NOR,      Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NXOR )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NXOR, 3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_SELECT )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_SELECT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_CONCAT )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_CONCAT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_ZEROPAD )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_ZEROPAD, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_SIGNEXT )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_SIGNEXT, 0 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_NOT )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_NOT,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_IMPL )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_IMPL,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_AND )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_AND,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_OR )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_OR,         Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_XOR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_XOR,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) + 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_EQU )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_EQU,     4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_NOTEQU )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_NOTEQU,  4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_LESS )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_LESS,    6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_MORE )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_MORE,    6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_LESSEQU ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_LESSEQU, 6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_MOREEQU ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_MOREEQU, 6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_AND )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_AND,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_OR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_OR,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_XOR )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_XOR,   3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 3 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NAND )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NAND,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NOR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NOR,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NXOR )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NXOR,   3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 3 );
        else if ( pObj->Type == WLC_OBJ_ARI_ADD )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_ADD,      9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_SUB )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SUB,      9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_MULTI )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MULTI,    9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_DIVIDE )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_DIVIDE,  13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 19 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + 10 );
        else if ( pObj->Type == WLC_OBJ_ARI_REM )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_REM,     13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 7 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 2  );
        else if ( pObj->Type == WLC_OBJ_ARI_MODULUS )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MODULUS, 13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 7 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 2  );
        else if ( pObj->Type == WLC_OBJ_ARI_POWER ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_POWER,   10 * (int)pow(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)),Wlc_ObjRange(Wlc_ObjFanin0(p, pObj))) );
        else if ( pObj->Type == WLC_OBJ_ARI_MINUS )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MINUS,    4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_SQRT )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SQRT,    11 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) / 8 + 5 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) / 2 - 5  );
        else if ( pObj->Type == WLC_OBJ_ARI_SQUARE )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SQUARE,   5 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin1(p, pObj))  );
    }
    if ( nCountRange )
    {
        printf( "Warning: %d objects of the design have non-zero-based ranges.\n", nCountRange );
        printf( "In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n", Wlc_ObjId(p, pObjRange), 
            Abc_NamStr(p->pManName, Wlc_ObjNameId(p, Wlc_ObjId(p, pObjRange))), Wlc_ObjRange(pObjRange), pObjRange->End, pObjRange->Beg );
    }
    // print by occurrence
    printf( "ID  :  name  occurrence    and2 (occurrence)<output_range>=<input_range>.<input_range> ...\n" );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
    {
        Vec_Wrd_t * vType  = (Vec_Wrd_t *)Vec_PtrEntry( vTypes, i );
        Vec_Wrd_t * vOccur = (Vec_Wrd_t *)Vec_PtrEntry( vOccurs, i );
        if ( p->nObjs[i] == 0 )
            continue;
        printf( "%2d  :  %-8s  %6d%8d ", i, Wlc_Names[i], p->nObjs[i], Vec_IntEntry(vAnds, i) );
        // sort by occurence
        Wlc_NtkPrintDistribSortOne( vTypes, vOccurs, i );
        Vec_WrdForEachEntry( vType, Sign, k )
        {
            Wlc_NtkPrintDistribFromSign( Sign, &s, &s0, &s1 );
            if ( ((k % 6) == 5 && s1) || ((k % 8) == 7 && !s1) )
                printf( "\n                                " );
            printf( "(%d)", (int)Vec_WrdEntry( vOccur, k ) );
            printf( "%s%d",      Abc_LitIsCompl(s)?"-":"",  Abc_Lit2Var(s) );
            if ( s0 )
                printf( "=%s%d", Abc_LitIsCompl(s0)?"-":"", Abc_Lit2Var(s0) );
            if ( s1 )
                printf( ".%s%d", Abc_LitIsCompl(s1)?"-":"", Abc_Lit2Var(s1) );
            printf( " " );
        }
        printf( "\n" );
    }
    Vec_VecFree( (Vec_Vec_t *)vTypes );
    Vec_VecFree( (Vec_Vec_t *)vOccurs );
    Vec_IntFree( vAnds );
}